

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O1

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  undefined4 in_ECX;
  int iVar12;
  int *piVar13;
  int iVar14;
  void *pvVar15;
  Mat *pMVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  uint uVar29;
  undefined1 auVar28 [16];
  ulong local_178;
  void *ptr;
  undefined8 uStack_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  int local_150;
  Allocator *local_148;
  int iStack_140;
  uint uStack_13c;
  int iStack_138;
  uint uStack_134;
  undefined8 uStack_130;
  Mat *local_128;
  allocator_type local_119;
  Mat *local_118;
  ulong local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Mat local_e8;
  ulong local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  long local_80;
  void *local_78;
  long local_70;
  void *local_68;
  long local_60;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar23 = bottom_top_blob->w;
  pMVar16 = *(Mat **)&bottom_top_blob->h;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = pMVar16;
  uVar18 = bottom_top_blob->elemsize;
  local_e8.h = (int)pMVar16;
  uVar22 = local_e8.h * uVar23;
  local_e8.allocator = opt->workspace_allocator;
  local_e8.c = (int)((ulong)pMVar16 >> 0x20);
  auVar1._4_4_ = -(uint)(local_e8.h == 0);
  auVar1._0_4_ = -(uint)(uVar23 == 0);
  auVar1._8_4_ = -(uint)(local_e8.c == 0);
  auVar1._12_4_ = 0;
  movmskps(in_ECX,auVar1 << 0x20);
  local_e8.elemsize._0_4_ = (undefined4)uVar18;
  uVar4 = (undefined4)local_e8.elemsize;
  local_e8.elemsize._4_4_ = (undefined4)(uVar18 >> 0x20);
  uVar5 = local_e8.elemsize._4_4_;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elempack = 1;
  local_e8.dims = 3;
  local_e8.cstep = ((long)(int)uVar22 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
  piVar13 = (int *)(ulong)(uint)local_e8.c;
  local_128 = bottom_top_blob;
  local_118 = pMVar16;
  local_e8.w = uVar23;
  uVar24 = uVar23;
  local_e8.refcount = (int *)0x0;
  if ((long)local_e8.c * local_e8.cstep != 0) {
    uVar17 = (long)local_e8.c * local_e8.cstep * uVar18 + 3 & 0xfffffffffffffffc;
    local_108 = ZEXT416(uVar23);
    local_f8 = auVar28;
    if (local_e8.allocator == (Allocator *)0x0) {
      ptr = (void *)0x0;
      iVar7 = posix_memalign(&ptr,0x10,uVar17 + 4);
      if (iVar7 != 0) {
        ptr = (void *)0x0;
      }
      local_e8.data = ptr;
      pMVar16 = (Mat *)local_f8._0_8_;
      uVar24 = local_108._0_4_;
    }
    else {
      local_e8.data = (void *)(**(code **)(*(long *)local_e8.allocator + 0x10))(local_e8.allocator);
      pMVar16 = (Mat *)local_f8._0_8_;
      uVar24 = local_108._0_4_;
    }
    piVar13 = (int *)((long)local_e8.data + uVar17);
    *(undefined4 *)((long)local_e8.data + uVar17) = 1;
    local_e8.refcount = piVar13;
  }
  iVar7 = -100;
  if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_0013a30a;
  uVar29 = (uint)((ulong)pMVar16 >> 0x20);
  if (0 < (int)uVar29) {
    pvVar11 = local_128->data;
    piVar13 = (int *)(local_128->cstep * local_128->elemsize);
    uVar17 = 0;
    pvVar15 = local_e8.data;
    do {
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          fVar26 = *(float *)((long)pvVar11 + uVar21 * 4);
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar26 * fVar26;
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
      }
      uVar17 = uVar17 + 1;
      pvVar15 = (void *)((long)pvVar15 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
      pvVar11 = (void *)((long)pvVar11 + (long)piVar13);
    } while (uVar17 != uVar29);
  }
  local_f8._0_8_ = this;
  if (this->region_type == 0) {
    local_148 = opt->workspace_allocator;
    auVar2._4_4_ = -(uint)((int)pMVar16 == 0);
    auVar2._0_4_ = -(uint)(uVar24 == 0);
    auVar2._8_4_ = -(uint)(uVar29 == 0);
    auVar2._12_4_ = 0;
    movmskps((int)piVar13,auVar2 << 0x20);
    ptr = (void *)0x0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = 0;
    uStack_160 = (int *)0x0;
    local_150 = 1;
    iStack_140 = 3;
    iStack_138 = (int)local_118;
    uStack_130 = ((long)(int)uVar22 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
    uStack_158 = uVar4;
    uStack_154 = uVar5;
    uStack_13c = uVar23;
    uStack_134 = uVar29;
    if ((long)(int)uVar29 * uStack_130 != 0) {
      uVar18 = (long)(int)uVar29 * uStack_130 * uVar18 + 3 & 0xfffffffffffffffc;
      if (local_148 == (Allocator *)0x0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        iVar9 = posix_memalign((void **)&_space_ofs,0x10,uVar18 + 4);
        ptr = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
        if (iVar9 != 0) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          ptr = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
        }
      }
      else {
        ptr = (void *)(**(code **)(*(long *)local_148 + 0x10))(local_148);
      }
      uStack_160 = (int *)((long)ptr + uVar18);
      *(undefined4 *)((long)ptr + uVar18) = 1;
    }
    bVar25 = ptr == (void *)0x0 || (long)(int)uStack_134 * uStack_130 == 0;
    if (bVar25) {
      if (uStack_160 != (int *)0x0) {
        LOCK();
        *uStack_160 = *uStack_160 + -1;
        UNLOCK();
        if (*uStack_160 == 0) {
          if (local_148 == (Allocator *)0x0) {
            if (ptr != (void *)0x0) {
              free(ptr);
            }
          }
          else {
            (**(code **)(*(long *)local_148 + 0x18))();
          }
        }
      }
      uStack_158 = 0;
      uStack_154 = 0;
      local_150 = 0;
      ptr = (void *)0x0;
      uStack_160._0_4_ = 0;
      uStack_160._4_4_ = 0;
      iStack_140 = 0;
      uStack_13c = 0;
      iStack_138 = 0;
      uStack_134 = 0;
      uStack_130._0_4_ = 0;
      uStack_130._4_4_ = 0;
      goto LAB_0013a30a;
    }
    local_a0 = CONCAT71(local_a0._1_7_,bVar25);
    if (0 < (int)(uStack_134 * (int)uStack_130)) {
      memset(ptr,0,(ulong)(uStack_134 * (int)uStack_130) << 2);
    }
    if (0 < (int)uVar29) {
      uVar3 = local_f8._0_8_;
      fVar26 = *(float *)(local_f8._0_8_ + 0x88);
      uVar24 = *(int *)(local_f8._0_8_ + 0x84) / 2;
      local_90 = (void *)(ulong)-uVar24;
      pvVar11 = local_128->data;
      local_110 = (ulong)(int)uVar24;
      local_118 = (Mat *)(ulong)uVar29;
      fVar27 = 1.0 / (float)*(int *)(local_f8._0_8_ + 0x84);
      local_88 = uStack_130 * CONCAT44(uStack_154,uStack_158);
      local_98 = local_128->cstep * local_128->elemsize;
      pMVar16 = (Mat *)0x0;
      local_80 = CONCAT44(local_80._4_4_,uVar22);
      local_108._0_4_ = fVar27;
      pvVar15 = ptr;
      uVar23 = uVar22;
      do {
        uVar10 = (int)local_90 + (int)pMVar16;
        if ((long)(int)uVar10 <= (long)((long)&pMVar16->data + local_110)) {
          do {
            if ((uVar10 < uVar29) && (0 < (int)uVar23)) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) +
                     *(float *)((long)local_e8.data +
                               uVar18 * 4 +
                               (ulong)uVar10 *
                               local_e8.cstep *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                uVar18 = uVar18 + 1;
              } while (uVar22 != uVar18);
            }
            bVar25 = uVar10 != uVar24;
            uVar10 = uVar10 + 1;
          } while (bVar25);
        }
        local_128 = pMVar16;
        if (0 < (int)uVar23) {
          uVar18 = 0;
          do {
            fVar27 = powf(*(float *)((long)pvVar15 + uVar18 * 4) * fVar26 * fVar27 +
                          *(float *)(uVar3 + 0x90),-*(float *)(uVar3 + 0x8c));
            *(float *)((long)pvVar11 + uVar18 * 4) = fVar27 * *(float *)((long)pvVar11 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
            fVar27 = (float)local_108._0_4_;
          } while (uVar22 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pMVar16 = (Mat *)((long)&local_128->data + 1);
        pvVar15 = (void *)((long)pvVar15 + local_88);
        pvVar11 = (void *)((long)pvVar11 + local_98);
        uVar23 = (uint)local_80;
      } while (pMVar16 != local_118);
    }
    iVar7 = -100;
    if (uStack_160 != (int *)0x0) {
      LOCK();
      *uStack_160 = *uStack_160 + -1;
      UNLOCK();
      if (*uStack_160 == 0) {
        if (local_148 == (Allocator *)0x0) {
          if (ptr != (void *)0x0) {
            free(ptr);
          }
        }
        else {
          (**(code **)(*(long *)local_148 + 0x18))();
        }
      }
    }
    uStack_158 = 0;
    uStack_154 = 0;
    local_150 = 0;
    ptr = (void *)0x0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = 0;
    iStack_140 = 0;
    uStack_13c = 0;
    iStack_138 = 0;
    uStack_134 = 0;
    uStack_130._0_4_ = 0;
    uStack_130._4_4_ = 0;
    if ((char)local_a0 != '\0') goto LAB_0013a30a;
  }
  else if (this->region_type == 1) {
    ptr = local_e8.data;
    uStack_158 = (undefined4)local_e8.elemsize;
    uStack_154 = local_e8.elemsize._4_4_;
    local_150 = local_e8.elempack;
    local_148 = local_e8.allocator;
    iStack_140 = local_e8.dims;
    uStack_13c = local_e8.w;
    iStack_138 = local_e8.h;
    uStack_134 = local_e8.c;
    uStack_130._0_4_ = (int)local_e8.cstep;
    uStack_130._4_4_ = (undefined4)(local_e8.cstep >> 0x20);
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + 1;
      UNLOCK();
    }
    uVar24 = this->local_size;
    uVar22 = uVar23;
    uStack_160 = local_e8.refcount;
    if (1 < (int)uVar24) {
      uVar22 = uVar24 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_e8,(Mat *)&ptr,uVar22,~uVar22 + uVar24,uVar22,~uVar22 + uVar24,0,0.0,
                       (Option *)&_space_ofs);
      uVar22 = uStack_13c;
      if (ptr == (void *)0x0 ||
          (long)(int)uStack_134 * CONCAT44(uStack_130._4_4_,(int)uStack_130) == 0) {
        iVar7 = -100;
        if (uStack_160 != (int *)0x0) {
          LOCK();
          *uStack_160 = *uStack_160 + -1;
          UNLOCK();
          if (*uStack_160 == 0) {
            if (local_148 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (**(code **)(*(long *)local_148 + 0x18))();
            }
          }
        }
        uStack_158 = 0;
        uStack_154 = 0;
        local_150 = 0;
        ptr = (void *)0x0;
        uStack_160._0_4_ = 0;
        uStack_160._4_4_ = 0;
        iStack_140 = 0;
        uStack_13c = 0;
        iStack_138 = 0;
        uStack_134 = 0;
        uStack_130._0_4_ = 0;
        uStack_130._4_4_ = 0;
        goto LAB_0013a30a;
      }
    }
    iVar7 = this->local_size;
    uVar24 = iVar7 * iVar7;
    local_108._0_4_ = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar24,&local_119);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = this->local_size;
    if (0 < iVar9) {
      iVar8 = 0;
      iVar12 = 0;
      iVar14 = 0;
      do {
        if (0 < this->local_size) {
          lVar20 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar14 + lVar20] = iVar12 + (int)lVar20;
            lVar20 = lVar20 + 1;
            iVar19 = (int)lVar20;
          } while (iVar19 < this->local_size);
          iVar14 = iVar14 + iVar19;
          iVar12 = iVar12 + iVar19;
        }
        iVar12 = iVar12 + (uVar22 - iVar9);
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->local_size);
    }
    if (0 < (int)uVar29) {
      local_80 = (long)(int)uVar23;
      local_60 = local_128->cstep * local_128->elemsize;
      local_68 = local_128->data;
      local_70 = CONCAT44(uStack_130._4_4_,(int)uStack_130) * CONCAT44(uStack_154,uStack_158);
      local_78 = ptr;
      local_a0 = (ulong)uVar29;
      local_88 = (ulong)local_118 & 0xffffffff;
      local_98 = (long)(int)uStack_13c * CONCAT44(uStack_154,uStack_158);
      local_128 = (Mat *)CONCAT44(local_128._4_4_,1.0 / (float)(int)uVar24);
      local_110 = 0;
      do {
        if (0 < (int)local_118) {
          local_90 = (void *)(local_70 * local_110 + (long)local_78);
          pvVar11 = (void *)(local_60 * local_110 + (long)local_68);
          local_178 = 0;
          do {
            pvVar15 = local_90;
            if (0 < (int)uVar23) {
              lVar20 = local_178 * local_98;
              uVar18 = 0;
              do {
                if (iVar7 == 0) {
                  fVar26 = 0.0;
                }
                else {
                  fVar26 = 0.0;
                  uVar17 = 0;
                  do {
                    fVar26 = fVar26 + *(float *)((long)pvVar15 +
                                                (long)piVar6[uVar17] * 4 + uVar18 * 4 + lVar20);
                    uVar17 = uVar17 + 1;
                  } while (uVar24 + (uVar24 == 0) != uVar17);
                }
                fVar26 = powf(fVar26 * (float)local_108._0_4_ * local_128._0_4_ +
                              *(float *)(local_f8._0_8_ + 0x90),-*(float *)(local_f8._0_8_ + 0x8c));
                *(float *)((long)pvVar11 + uVar18 * 4) =
                     fVar26 * *(float *)((long)pvVar11 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar23);
            }
            pvVar11 = (void *)((long)pvVar11 + local_80 * 4);
            local_178 = local_178 + 1;
          } while (local_178 != local_88);
        }
        local_110 = local_110 + 1;
      } while (local_110 != local_a0);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uStack_160 != (int *)0x0) {
      LOCK();
      *uStack_160 = *uStack_160 + -1;
      UNLOCK();
      if (*uStack_160 == 0) {
        if (local_148 == (Allocator *)0x0) {
          if (ptr != (void *)0x0) {
            free(ptr);
          }
        }
        else {
          (**(code **)(*(long *)local_148 + 0x18))();
        }
      }
    }
    uStack_158 = 0;
    uStack_154 = 0;
    local_150 = 0;
    ptr = (void *)0x0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = 0;
    iStack_140 = 0;
    uStack_13c = 0;
    iStack_138 = 0;
    uStack_134 = 0;
    uStack_130._0_4_ = 0;
    uStack_130._4_4_ = 0;
  }
  iVar7 = 0;
LAB_0013a30a:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_e8.allocator + 0x18))();
      }
    }
  }
  return iVar7;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}